

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_connect_op_base::do_perform(reactor_op *base)

{
  bool bVar1;
  status result;
  reactive_socket_connect_op_base *o;
  error_code *in_stack_00000018;
  socket_type in_stack_00000020;
  
  bVar1 = socket_ops::non_blocking_connect(in_stack_00000020,in_stack_00000018);
  return (uint)bVar1;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_connect_op_base* o(
        static_cast<reactive_socket_connect_op_base*>(base));

    status result = socket_ops::non_blocking_connect(
        o->socket_, o->ec_) ? done : not_done;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_connect", o->ec_));

    return result;
  }